

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  float *pfVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  float fVar13;
  
  if (0 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount) {
    lVar2 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
    lVar7 = 0;
    iVar9 = 0;
    do {
      iVar5 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
      auVar12 = ZEXT816(0) << 0x40;
      if (0 < iVar5) {
        iVar6 = iVar5;
        iVar8 = iVar9;
        do {
          auVar12 = vmaxss_avx(ZEXT416((uint)destP[iVar8]),auVar12);
          auVar12 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar8 + 1]),auVar12);
          auVar12 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar8 + 2]),auVar12);
          auVar12 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar8 + 3]),auVar12);
          iVar8 = iVar8 + (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      uVar3 = vcmpss_avx512f(auVar12,ZEXT416(0),0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar10 = (float)((uint)bVar4 * 0x3f800000 + (uint)!bVar4 * auVar12._0_4_);
      if (0 < iVar5) {
        fVar13 = 1.0 / fVar10;
        iVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
        iVar8 = iVar9;
        do {
          pfVar1 = destP + iVar8;
          auVar12._0_4_ = fVar13 * *pfVar1;
          auVar12._4_4_ = fVar13 * pfVar1[1];
          auVar12._8_4_ = fVar13 * pfVar1[2];
          auVar12._12_4_ = fVar13 * pfVar1[3];
          *(undefined1 (*) [16])(destP + iVar8) = auVar12;
          iVar8 = iVar8 + iVar6 * 4;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      if (((uint)lVar2 >> 10 & 1) == 0) {
        scaleFactors[lVar7] = fVar10;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar11 = log((double)fVar10);
          fVar10 = (float)(dVar11 + (double)cumulativeScaleFactors[lVar7]);
LAB_00139f54:
          cumulativeScaleFactors[lVar7] = fVar10;
        }
      }
      else {
        dVar11 = log((double)fVar10);
        scaleFactors[lVar7] = (float)dVar11;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar10 = (float)dVar11 + cumulativeScaleFactors[lVar7];
          goto LAB_00139f54;
        }
      }
      lVar7 = lVar7 + 1;
      iVar9 = iVar9 + 4;
    } while (lVar7 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}